

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::StructuredCFGAnalysis::SwitchMergeBlock(StructuredCFGAnalysis *this,uint32_t bb_id)

{
  uint32_t blk_id;
  CFG *this_00;
  BasicBlock *this_01;
  Instruction *this_02;
  Instruction *merge_inst;
  BasicBlock *header;
  uint32_t header_id;
  uint32_t bb_id_local;
  StructuredCFGAnalysis *this_local;
  
  blk_id = ContainingSwitch(this,bb_id);
  if (blk_id == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this_00 = IRContext::cfg(this->context_);
    this_01 = CFG::block(this_00,blk_id);
    this_02 = BasicBlock::GetMergeInst(this_01);
    this_local._4_4_ = opt::Instruction::GetSingleWordInOperand(this_02,0);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t StructuredCFGAnalysis::SwitchMergeBlock(uint32_t bb_id) {
  uint32_t header_id = ContainingSwitch(bb_id);
  if (header_id == 0) {
    return 0;
  }

  BasicBlock* header = context_->cfg()->block(header_id);
  Instruction* merge_inst = header->GetMergeInst();
  return merge_inst->GetSingleWordInOperand(kMergeNodeIndex);
}